

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O0

ostream * csm::MIC::operator<<(ostream *os,RangeList *rangeList)

{
  size_t sVar1;
  Range *range;
  ulong local_28;
  size_t i;
  size_t NUM_RANGES;
  RangeList *rangeList_local;
  ostream *os_local;
  
  sVar1 = RangeList::size(rangeList);
  for (local_28 = 0; local_28 < sVar1; local_28 = local_28 + 1) {
    range = RangeList::range(rangeList,local_28);
    operator<<(os,range);
    if (local_28 < sVar1 - 1) {
      std::operator<<(os," , ");
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os,const RangeList& rangeList)
{
   const size_t NUM_RANGES = rangeList.size();
   
   for (size_t i = 0; i < NUM_RANGES; ++i)
   {
      os << rangeList.range(i);
      
      if (i < (NUM_RANGES -1)) os << " , ";
   }
   
   return os;
}